

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O3

void __thiscall Rml::ElementText::GetRML(ElementText *this,String *content)

{
  String local_30;
  
  StringUtilities::EncodeRml(&local_30,&this->text);
  ::std::__cxx11::string::_M_append((char *)content,(ulong)local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ElementText::GetRML(String& content)
{
	content += StringUtilities::EncodeRml(text);
}